

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

int Cba_NtkInsertGiaLit(Cba_Ntk_t *p,int iLit,Vec_Int_t *vLit2Fon,int fUseXor)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  int *piVar5;
  char *__assertion;
  long lVar6;
  uint uVar7;
  
  if ((uint)iLit < 2) {
    return ~iLit;
  }
  if ((iLit < 0) || (vLit2Fon->nSize <= iLit)) goto LAB_0034fec2;
  iVar1 = vLit2Fon->pArray[(uint)iLit];
  if (-1 < iVar1) {
    return iVar1;
  }
  if ((iLit & 1U) == 0) {
    __assert_fail("Abc_LitIsCompl(iLit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaNtk.c"
                  ,0x3f0,"int Cba_NtkInsertGiaLit(Cba_Ntk_t *, int, Vec_Int_t *, int)");
  }
  uVar7 = iLit & 0x7ffffffe;
  if ((uint)vLit2Fon->nSize <= uVar7) goto LAB_0034fec2;
  if (vLit2Fon->pArray[uVar7] < 0) {
    __assert_fail("Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaNtk.c"
                  ,0x3f1,"int Cba_NtkInsertGiaLit(Cba_Ntk_t *, int, Vec_Int_t *, int)");
  }
  if (fUseXor == 0) {
    uVar4 = Cba_ObjAlloc(p,CBA_BOX_INV,1,1);
    if (vLit2Fon->nSize <= (int)uVar7) goto LAB_0034fec2;
    if ((int)uVar4 < 1) goto LAB_0034ff47;
    if ((p->vObjFin0).nSize <= (int)uVar4) goto LAB_0034fec2;
    iVar1 = (p->vObjFin0).pArray[uVar4];
    lVar6 = (long)iVar1;
    if (lVar6 < 1) goto LAB_0034fee1;
    if ((p->vFinFon).nSize <= iVar1) goto LAB_0034fec2;
    piVar2 = (p->vFinFon).pArray;
    if (piVar2[lVar6] == 0) {
      piVar5 = vLit2Fon->pArray;
      piVar2[lVar6] = piVar5[uVar7];
LAB_0034fe8d:
      if ((int)uVar4 < (p->vObjFon0).nSize) {
        if (vLit2Fon->nSize <= iLit) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iVar1 = (p->vObjFon0).pArray[uVar4];
        piVar5[(uint)iLit] = iVar1;
        if ((int)uVar4 < (p->vObjFon0).nSize) {
          return iVar1;
        }
      }
LAB_0034fec2:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  else {
    uVar4 = Cba_ObjAlloc(p,CBA_BOX_XOR,2,1);
    if (vLit2Fon->nSize <= (int)uVar7) goto LAB_0034fec2;
    if ((int)uVar4 < 1) {
LAB_0034ff47:
      __assertion = "i>0";
      goto LAB_0034ff4e;
    }
    if ((p->vObjFin0).nSize <= (int)uVar4) goto LAB_0034fec2;
    piVar2 = (p->vObjFin0).pArray;
    iVar1 = piVar2[uVar4];
    lVar6 = (long)iVar1;
    if (lVar6 < 1) {
LAB_0034fee1:
      __assert_fail("f>0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                    ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
    }
    if ((p->vFinFon).nSize <= iVar1) goto LAB_0034fec2;
    piVar3 = (p->vFinFon).pArray;
    if (piVar3[lVar6] == 0) {
      piVar5 = vLit2Fon->pArray;
      piVar3[lVar6] = piVar5[uVar7];
      if ((p->vObjFin0).nSize <= (int)uVar4) goto LAB_0034fec2;
      iVar1 = piVar2[uVar4];
      if (iVar1 < 0) goto LAB_0034fee1;
      uVar7 = iVar1 + 1;
      if ((p->vFinFon).nSize <= (int)uVar7) goto LAB_0034fec2;
      if (piVar3[uVar7] == 0) {
        piVar3[uVar7] = -2;
        goto LAB_0034fe8d;
      }
    }
  }
  __assertion = "Cba_ObjFinFon(p, i, k)== 0";
LAB_0034ff4e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                ,0x16e,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
}

Assistant:

static inline int Cba_NtkInsertGiaLit( Cba_Ntk_t * p, int iLit, Vec_Int_t * vLit2Fon, int fUseXor )
{
    int iObjNew;
    if ( iLit == 0 || iLit == 1 )
        return Cba_FonFromConst(iLit);
    if ( Vec_IntEntry(vLit2Fon, iLit) >= 0 )
        return Vec_IntEntry(vLit2Fon, iLit);
    assert( Abc_LitIsCompl(iLit) );
    assert( Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) >= 0 );
    // create inverter
    if ( fUseXor )
    {
        iObjNew = Cba_ObjAlloc( p, CBA_BOX_XOR, 2, 1 );
        Cba_ObjSetFinFon( p, iObjNew, 0, Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) );
        Cba_ObjSetFinFon( p, iObjNew, 1, Cba_FonFromConst(1) );
    }
    else
    {
        iObjNew = Cba_ObjAlloc( p, CBA_BOX_INV, 1, 1 );
        Cba_ObjSetFinFon( p, iObjNew, 0, Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) );
    }
    // save the result
    Vec_IntWriteEntry( vLit2Fon, iLit, Cba_ObjFon0(p, iObjNew) );
    return Cba_ObjFon0(p, iObjNew);
}